

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumn *pIVar2;
  int iVar3;
  float fVar4;
  float local_20;
  float local_1c;
  
  if ((table->LeftMostStretchedColumn == -1) || (table->RightMostStretchedColumn == -1)) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x87f,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  local_20 = 0.0;
  local_1c = 0.0;
  for (iVar3 = 0; iVar1 = table->ColumnsCount, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar3);
    if ((pIVar2->IsEnabled == true) && ((pIVar2->Flags & 8) != 0)) {
      if (pIVar2->StretchWeight <= 0.0) {
        __assert_fail("column->StretchWeight > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                      ,0x889,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
      }
      local_1c = local_1c + pIVar2->StretchWeight;
      local_20 = local_20 + pIVar2->WidthRequest;
    }
  }
  if ((0.0 < local_1c) && (0.0 < local_20)) {
    iVar3 = 0;
    while( true ) {
      if (iVar1 <= iVar3) {
        return;
      }
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar3);
      if (((pIVar2->IsEnabled == true) && ((pIVar2->Flags & 8) != 0)) &&
         (fVar4 = (pIVar2->WidthRequest / local_20) * local_1c, pIVar2->StretchWeight = fVar4,
         fVar4 <= 0.0)) break;
      iVar3 = iVar3 + 1;
      iVar1 = table->ColumnsCount;
    }
    __assert_fail("column->StretchWeight > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x896,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                ,0x88d,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}